

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

QOpenGLVertexArrayObjectHelper *
QOpenGLVertexArrayObjectHelper::vertexArrayObjectHelperForContext(QOpenGLContext *context)

{
  long lVar1;
  QOpenGLVertexArrayObjectHelper *this;
  
  lVar1 = *(long *)(context + 8);
  this = *(QOpenGLVertexArrayObjectHelper **)(lVar1 + 0xe8);
  if (this == (QOpenGLVertexArrayObjectHelper *)0x0) {
    this = (QOpenGLVertexArrayObjectHelper *)operator_new(0x20);
    QOpenGLVertexArrayObjectHelper(this,context);
    *(QOpenGLVertexArrayObjectHelper **)(lVar1 + 0xe8) = this;
    *(code **)(lVar1 + 0xf0) = vertexArrayObjectHelperDestroyCallback;
  }
  return this;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }